

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_select_image_section(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  int iVar1;
  int local_40;
  int local_3c;
  int hdunum;
  int ii;
  fitsfile *newptr;
  int *status_local;
  char *expr_local;
  char *outfile_local;
  fitsfile **fptr_local;
  
  newptr = (fitsfile *)status;
  status_local = (int *)expr;
  expr_local = outfile;
  outfile_local = (char *)fptr;
  iVar1 = ffinit((fitsfile **)&hdunum,outfile,status);
  if (iVar1 < 1) {
    ffghdn(*(fitsfile **)outfile_local,&local_40);
    if (*(int *)(*(long *)(*(long *)outfile_local + 8) + 0x1c) == 0) {
      for (local_3c = 1; local_3c < local_40; local_3c = local_3c + 1) {
        ffmahd(*(fitsfile **)outfile_local,local_3c,(int *)0x0,&newptr->HDUposition);
        iVar1 = ffcopy(*(fitsfile **)outfile_local,_hdunum,0,&newptr->HDUposition);
        if (0 < iVar1) {
          ffclos(_hdunum,&newptr->HDUposition);
          return newptr->HDUposition;
        }
      }
      ffmahd(*(fitsfile **)outfile_local,local_40,(int *)0x0,&newptr->HDUposition);
    }
    iVar1 = fits_copy_image_section
                      (*(fitsfile **)outfile_local,_hdunum,(char *)status_local,&newptr->HDUposition
                      );
    if (iVar1 < 1) {
      local_3c = local_40;
      if (*(int *)(*(long *)(*(long *)outfile_local + 8) + 0x1c) == 0) {
        while( true ) {
          local_3c = local_3c + 1;
          iVar1 = ffmahd(*(fitsfile **)outfile_local,local_3c,(int *)0x0,&newptr->HDUposition);
          if (0 < iVar1) break;
          ffcopy(*(fitsfile **)outfile_local,_hdunum,0,&newptr->HDUposition);
        }
        if (newptr->HDUposition == 0x6b) {
          newptr->HDUposition = 0;
        }
        else if (0 < newptr->HDUposition) {
          ffclos(_hdunum,&newptr->HDUposition);
          return newptr->HDUposition;
        }
      }
      else {
        local_3c = local_40 + 1;
      }
      ffclos(*(fitsfile **)outfile_local,&newptr->HDUposition);
      *(fitsfile **)outfile_local = _hdunum;
      if (local_3c + -1 == local_40) {
        iVar1 = ffrdef(*(fitsfile **)outfile_local,&newptr->HDUposition);
        if (0 < iVar1) {
          ffclos(*(fitsfile **)outfile_local,&newptr->HDUposition);
          return newptr->HDUposition;
        }
      }
      else {
        ffmahd(*(fitsfile **)outfile_local,local_40,(int *)0x0,&newptr->HDUposition);
      }
      fptr_local._4_4_ = newptr->HDUposition;
    }
    else {
      ffclos(_hdunum,&newptr->HDUposition);
      fptr_local._4_4_ = newptr->HDUposition;
    }
  }
  else {
    ffpmsg("failed to create output file for image section:");
    ffpmsg(expr_local);
    fptr_local._4_4_ = newptr->HDUposition;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_select_image_section(
           fitsfile **fptr,  /* IO - pointer to input image; on output it  */
                             /*      points to the new subimage */
           char *outfile,    /* I - name for output file        */
           char *expr,       /* I - Image section expression    */
           int *status)
{
  /*
     copies an image section from the input file to a new output file.
     Any HDUs preceding or following the image are also copied to the
     output file.
  */

    fitsfile *newptr;
    int ii, hdunum;

    /* create new empty file to hold the image section */
    if (ffinit(&newptr, outfile, status) > 0)
    {
        ffpmsg(
         "failed to create output file for image section:");
        ffpmsg(outfile);
        return(*status);
    }

    fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

    /* copy all preceding extensions to the output file, if 'only_one' flag not set */
    if (!(((*fptr)->Fptr)->only_one)) {
      for (ii = 1; ii < hdunum; ii++)
      {
        fits_movabs_hdu(*fptr, ii, NULL, status);
        if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
        {
            ffclos(newptr, status);
            return(*status);
        }
      }

      /* move back to the original HDU position */
      fits_movabs_hdu(*fptr, hdunum, NULL, status);
    }

    if (fits_copy_image_section(*fptr, newptr, expr, status) > 0)
    {
        ffclos(newptr, status);
        return(*status);
    }

    /* copy any remaining HDUs to the output file, if 'only_one' flag not set */

    if (!(((*fptr)->Fptr)->only_one)) {
      for (ii = hdunum + 1; 1; ii++)
      {
        if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

        fits_copy_hdu(*fptr, newptr, 0, status);
      }

      if (*status == END_OF_FILE)   
        *status = 0;              /* got the expected EOF error; reset = 0  */
      else if (*status > 0)
      {
        ffclos(newptr, status);
        return(*status);
      }
    } else {
      ii = hdunum + 1;  /* this value of ii is required below */
    }

    /* close the original file and return ptr to the new image */
    ffclos(*fptr, status);

    *fptr = newptr; /* reset the pointer to the new table */

    /* move back to the image subsection */
    if (ii - 1 != hdunum)
        fits_movabs_hdu(*fptr, hdunum, NULL, status);
    else
    {
        /* may have to reset BSCALE and BZERO pixel scaling, */
        /* since the keywords were previously turned off */

        if (ffrdef(*fptr, status) > 0)  
        {
            ffclos(*fptr, status);
            return(*status);
        }

    }

    return(*status);
}